

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleHashTable.h
# Opt level: O0

void __thiscall
SimpleHashTable<void_*,_Memory::Recycler::PinRecord,_Memory::HeapAllocator,_DefaultComparer,_true,_PrimePolicy>
::~SimpleHashTable(SimpleHashTable<void_*,_Memory::Recycler::PinRecord,_Memory::HeapAllocator,_DefaultComparer,_true,_PrimePolicy>
                   *this)

{
  SimpleHashEntry<void_*,_Memory::Recycler::PinRecord> *pSVar1;
  EntryType *current;
  EntryType *next;
  EntryType *entry;
  uint i;
  SimpleHashTable<void_*,_Memory::Recycler::PinRecord,_Memory::HeapAllocator,_DefaultComparer,_true,_PrimePolicy>
  *this_local;
  
  for (entry._4_4_ = 0; entry._4_4_ < this->size; entry._4_4_ = entry._4_4_ + 1) {
    next = this->table[entry._4_4_];
    while (next != (EntryType *)0x0) {
      pSVar1 = next->next;
      Memory::
      DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,SimpleHashEntry<void*,Memory::Recycler::PinRecord>>
                (this->allocator,next);
      next = pSVar1;
    }
  }
  while (this->free != (EntryType *)0x0) {
    pSVar1 = this->free;
    this->free = pSVar1->next;
    Memory::
    DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,SimpleHashEntry<void*,Memory::Recycler::PinRecord>>
              (this->allocator,pSVar1);
  }
  Memory::DeleteArray<Memory::HeapAllocator,SimpleHashEntry<void*,Memory::Recycler::PinRecord>*>
            (this->allocator,(ulong)this->size,this->table);
  return;
}

Assistant:

~SimpleHashTable()
    {
        for (uint i = 0; i < size; i++)
        {
            EntryType * entry = table[i];
            while (entry != nullptr)
            {
                EntryType * next = entry->next;
                AllocatorDelete(TAllocator, allocator, entry);
                entry = next;
            }
        }

        while(free)
        {
            EntryType* current = free;
            free = current->next;
            AllocatorDelete(TAllocator, allocator, current);
        }
        AllocatorDeleteArray(TAllocator, allocator,  size, table);
    }